

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O1

void rhash_md5_process_block(uint *state,uint *x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  
  uVar1 = state[1];
  uVar2 = state[2];
  uVar3 = state[3];
  uVar17 = *x;
  uVar4 = ((uVar3 ^ uVar2) & uVar1 ^ uVar3) + *state + uVar17 + 0xd76aa478;
  uVar24 = x[1];
  uVar5 = (uVar4 * 0x80 | uVar4 >> 0x19) + uVar1;
  uVar4 = ((uVar2 ^ uVar1) & uVar5 ^ uVar2) + uVar3 + uVar24 + 0xe8c7b756;
  uVar9 = (uVar4 * 0x1000 | uVar4 >> 0x14) + uVar5;
  uVar4 = x[2];
  uVar12 = ((uVar5 ^ uVar1) & uVar9 ^ uVar1) + uVar4 + uVar2 + 0x242070db;
  uVar13 = (uVar12 * 0x20000 | uVar12 >> 0xf) + uVar9;
  uVar12 = x[3];
  uVar21 = uVar1 + uVar12 + ((uVar9 ^ uVar5) & uVar13 ^ uVar5) + 0xc1bdceee;
  uVar22 = (uVar21 * 0x400000 | uVar21 >> 10) + uVar13;
  uVar21 = x[4];
  uVar5 = uVar5 + uVar21 + ((uVar13 ^ uVar9) & uVar22 ^ uVar9) + 0xf57c0faf;
  uVar6 = (uVar5 * 0x80 | uVar5 >> 0x19) + uVar22;
  uVar5 = x[5];
  uVar9 = uVar9 + uVar5 + ((uVar22 ^ uVar13) & uVar6 ^ uVar13) + 0x4787c62a;
  uVar10 = (uVar9 * 0x1000 | uVar9 >> 0x14) + uVar6;
  uVar9 = x[6];
  uVar13 = uVar13 + uVar9 + ((uVar6 ^ uVar22) & uVar10 ^ uVar22) + 0xa8304613;
  uVar14 = (uVar13 * 0x20000 | uVar13 >> 0xf) + uVar10;
  uVar13 = x[7];
  uVar22 = uVar22 + uVar13 + ((uVar10 ^ uVar6) & uVar14 ^ uVar6) + 0xfd469501;
  uVar23 = (uVar22 * 0x400000 | uVar22 >> 10) + uVar14;
  uVar22 = x[8];
  uVar6 = uVar6 + uVar22 + ((uVar14 ^ uVar10) & uVar23 ^ uVar10) + 0x698098d8;
  uVar7 = (uVar6 * 0x80 | uVar6 >> 0x19) + uVar23;
  uVar6 = x[9];
  uVar10 = uVar10 + uVar6 + ((uVar23 ^ uVar14) & uVar7 ^ uVar14) + 0x8b44f7af;
  uVar11 = (uVar10 * 0x1000 | uVar10 >> 0x14) + uVar7;
  uVar10 = x[10];
  uVar14 = (uVar14 + uVar10 + ((uVar7 ^ uVar23) & uVar11 ^ uVar23)) - 0xa44f;
  uVar15 = (uVar14 * 0x20000 | uVar14 >> 0xf) + uVar11;
  uVar14 = x[0xb];
  uVar23 = ((uVar11 ^ uVar7) & uVar15 ^ uVar7) + uVar23 + uVar14 + 0x895cd7be;
  uVar18 = (uVar23 * 0x400000 | uVar23 >> 10) + uVar15;
  uVar23 = x[0xc];
  uVar7 = uVar7 + uVar23 + ((uVar15 ^ uVar11) & uVar18 ^ uVar11) + 0x6b901122;
  uVar8 = (uVar7 * 0x80 | uVar7 >> 0x19) + uVar18;
  uVar7 = x[0xd];
  uVar11 = ((uVar18 ^ uVar15) & uVar8 ^ uVar15) + uVar11 + uVar7 + 0xfd987193;
  uVar20 = (uVar11 * 0x1000 | uVar11 >> 0x14) + uVar8;
  uVar11 = x[0xe];
  uVar15 = uVar15 + uVar11 + ((uVar8 ^ uVar18) & uVar20 ^ uVar18) + 0xa679438e;
  uVar16 = (uVar15 * 0x20000 | uVar15 >> 0xf) + uVar20;
  uVar15 = x[0xf];
  uVar18 = uVar18 + uVar15 + ((uVar20 ^ uVar8) & uVar16 ^ uVar8) + 0x49b40821;
  uVar19 = (uVar18 * 0x400000 | uVar18 >> 10) + uVar16;
  uVar8 = uVar8 + uVar24 + ((uVar19 ^ uVar16) & uVar20 ^ uVar16) + 0xf61e2562;
  uVar8 = (uVar8 * 0x20 | uVar8 >> 0x1b) + uVar19;
  uVar18 = ((uVar8 ^ uVar19) & uVar16 ^ uVar19) + uVar20 + uVar9 + 0xc040b340;
  uVar18 = (uVar18 * 0x200 | uVar18 >> 0x17) + uVar8;
  uVar16 = uVar16 + uVar14 + ((uVar18 ^ uVar8) & uVar19 ^ uVar8) + 0x265e5a51;
  uVar16 = (uVar16 * 0x4000 | uVar16 >> 0x12) + uVar18;
  uVar19 = uVar19 + uVar17 + ((uVar16 ^ uVar18) & uVar8 ^ uVar18) + 0xe9b6c7aa;
  uVar19 = (uVar19 * 0x100000 | uVar19 >> 0xc) + uVar16;
  uVar8 = uVar8 + uVar5 + ((uVar19 ^ uVar16) & uVar18 ^ uVar16) + 0xd62f105d;
  uVar8 = (uVar8 * 0x20 | uVar8 >> 0x1b) + uVar19;
  uVar18 = uVar18 + uVar10 + ((uVar8 ^ uVar19) & uVar16 ^ uVar19) + 0x2441453;
  uVar18 = (uVar18 * 0x200 | uVar18 >> 0x17) + uVar8;
  uVar16 = uVar16 + uVar15 + ((uVar18 ^ uVar8) & uVar19 ^ uVar8) + 0xd8a1e681;
  uVar16 = (uVar16 * 0x4000 | uVar16 >> 0x12) + uVar18;
  uVar19 = uVar19 + uVar21 + ((uVar16 ^ uVar18) & uVar8 ^ uVar18) + 0xe7d3fbc8;
  uVar19 = (uVar19 * 0x100000 | uVar19 >> 0xc) + uVar16;
  uVar8 = uVar8 + uVar6 + ((uVar19 ^ uVar16) & uVar18 ^ uVar16) + 0x21e1cde6;
  uVar8 = (uVar8 * 0x20 | uVar8 >> 0x1b) + uVar19;
  uVar18 = uVar18 + uVar11 + ((uVar8 ^ uVar19) & uVar16 ^ uVar19) + 0xc33707d6;
  uVar18 = (uVar18 * 0x200 | uVar18 >> 0x17) + uVar8;
  uVar16 = uVar16 + uVar12 + ((uVar18 ^ uVar8) & uVar19 ^ uVar8) + 0xf4d50d87;
  uVar16 = (uVar16 * 0x4000 | uVar16 >> 0x12) + uVar18;
  uVar19 = uVar19 + uVar22 + ((uVar16 ^ uVar18) & uVar8 ^ uVar18) + 0x455a14ed;
  uVar19 = (uVar19 * 0x100000 | uVar19 >> 0xc) + uVar16;
  uVar8 = uVar8 + uVar7 + ((uVar19 ^ uVar16) & uVar18 ^ uVar16) + 0xa9e3e905;
  uVar8 = (uVar8 * 0x20 | uVar8 >> 0x1b) + uVar19;
  uVar18 = uVar18 + uVar4 + ((uVar8 ^ uVar19) & uVar16 ^ uVar19) + 0xfcefa3f8;
  uVar18 = (uVar18 * 0x200 | uVar18 >> 0x17) + uVar8;
  uVar16 = uVar16 + uVar13 + ((uVar18 ^ uVar8) & uVar19 ^ uVar8) + 0x676f02d9;
  uVar16 = (uVar16 * 0x4000 | uVar16 >> 0x12) + uVar18;
  uVar19 = uVar19 + uVar23 + ((uVar16 ^ uVar18) & uVar8 ^ uVar18) + 0x8d2a4c8a;
  uVar19 = (uVar19 * 0x100000 | uVar19 >> 0xc) + uVar16;
  uVar8 = ((uVar19 ^ uVar16 ^ uVar18) + uVar8 + uVar5) - 0x5c6be;
  uVar20 = (uVar8 * 0x10 | uVar8 >> 0x1c) + uVar19;
  uVar8 = (uVar19 ^ uVar16 ^ uVar20) + uVar18 + uVar22 + 0x8771f681;
  uVar8 = (uVar8 * 0x800 | uVar8 >> 0x15) + uVar20;
  uVar18 = (uVar20 ^ uVar19 ^ uVar8) + uVar16 + uVar14 + 0x6d9d6122;
  uVar18 = (uVar18 * 0x10000 | uVar18 >> 0x10) + uVar8;
  uVar16 = (uVar8 ^ uVar20 ^ uVar18) + uVar19 + uVar11 + 0xfde5380c;
  uVar16 = (uVar16 * 0x800000 | uVar16 >> 9) + uVar18;
  uVar19 = (uVar18 ^ uVar8 ^ uVar16) + uVar20 + uVar24 + 0xa4beea44;
  uVar19 = (uVar19 * 0x10 | uVar19 >> 0x1c) + uVar16;
  uVar8 = uVar8 + uVar21 + (uVar16 ^ uVar18 ^ uVar19) + 0x4bdecfa9;
  uVar8 = (uVar8 * 0x800 | uVar8 >> 0x15) + uVar19;
  uVar18 = uVar18 + uVar13 + (uVar19 ^ uVar16 ^ uVar8) + 0xf6bb4b60;
  uVar18 = (uVar18 * 0x10000 | uVar18 >> 0x10) + uVar8;
  uVar16 = uVar16 + uVar10 + (uVar8 ^ uVar19 ^ uVar18) + 0xbebfbc70;
  uVar16 = (uVar16 * 0x800000 | uVar16 >> 9) + uVar18;
  uVar19 = uVar19 + uVar7 + (uVar18 ^ uVar8 ^ uVar16) + 0x289b7ec6;
  uVar19 = (uVar19 * 0x10 | uVar19 >> 0x1c) + uVar16;
  uVar8 = uVar8 + uVar17 + (uVar16 ^ uVar18 ^ uVar19) + 0xeaa127fa;
  uVar8 = (uVar8 * 0x800 | uVar8 >> 0x15) + uVar19;
  uVar18 = uVar18 + uVar12 + (uVar19 ^ uVar16 ^ uVar8) + 0xd4ef3085;
  uVar18 = (uVar18 * 0x10000 | uVar18 >> 0x10) + uVar8;
  uVar16 = uVar16 + uVar9 + (uVar8 ^ uVar19 ^ uVar18) + 0x4881d05;
  uVar16 = (uVar16 * 0x800000 | uVar16 >> 9) + uVar18;
  uVar19 = uVar19 + uVar6 + (uVar18 ^ uVar8 ^ uVar16) + 0xd9d4d039;
  uVar19 = (uVar19 * 0x10 | uVar19 >> 0x1c) + uVar16;
  uVar8 = uVar8 + uVar23 + (uVar16 ^ uVar18 ^ uVar19) + 0xe6db99e5;
  uVar8 = (uVar8 * 0x800 | uVar8 >> 0x15) + uVar19;
  uVar18 = uVar18 + uVar15 + (uVar19 ^ uVar16 ^ uVar8) + 0x1fa27cf8;
  uVar18 = (uVar18 * 0x10000 | uVar18 >> 0x10) + uVar8;
  uVar16 = uVar16 + uVar4 + (uVar8 ^ uVar19 ^ uVar18) + 0xc4ac5665;
  uVar16 = (uVar16 * 0x800000 | uVar16 >> 9) + uVar18;
  uVar17 = ((~uVar8 | uVar16) ^ uVar18) + uVar19 + uVar17 + 0xf4292244;
  uVar19 = (uVar17 * 0x40 | uVar17 >> 0x1a) + uVar16;
  uVar17 = ((~uVar18 | uVar19) ^ uVar16) + uVar8 + uVar13 + 0x432aff97;
  uVar8 = (uVar17 * 0x400 | uVar17 >> 0x16) + uVar19;
  uVar17 = uVar18 + uVar11 + ((~uVar16 | uVar8) ^ uVar19) + 0xab9423a7;
  uVar13 = (uVar17 * 0x8000 | uVar17 >> 0x11) + uVar8;
  uVar17 = ((~uVar19 | uVar13) ^ uVar8) + uVar16 + uVar5 + 0xfc93a039;
  uVar17 = (uVar17 * 0x200000 | uVar17 >> 0xb) + uVar13;
  uVar5 = ((~uVar8 | uVar17) ^ uVar13) + uVar19 + uVar23 + 0x655b59c3;
  uVar5 = (uVar5 * 0x40 | uVar5 >> 0x1a) + uVar17;
  uVar12 = uVar8 + uVar12 + ((~uVar13 | uVar5) ^ uVar17) + 0x8f0ccc92;
  uVar23 = (uVar12 * 0x400 | uVar12 >> 0x16) + uVar5;
  uVar12 = (uVar13 + uVar10 + ((~uVar17 | uVar23) ^ uVar5)) - 0x100b83;
  uVar12 = (uVar12 * 0x8000 | uVar12 >> 0x11) + uVar23;
  uVar17 = uVar17 + uVar24 + ((~uVar5 | uVar12) ^ uVar23) + 0x85845dd1;
  uVar17 = (uVar17 * 0x200000 | uVar17 >> 0xb) + uVar12;
  uVar24 = uVar5 + uVar22 + ((~uVar23 | uVar17) ^ uVar12) + 0x6fa87e4f;
  uVar13 = (uVar24 * 0x40 | uVar24 >> 0x1a) + uVar17;
  uVar24 = ((~uVar12 | uVar13) ^ uVar17) + uVar23 + uVar15 + 0xfe2ce6e0;
  uVar5 = (uVar24 * 0x400 | uVar24 >> 0x16) + uVar13;
  uVar24 = uVar12 + uVar9 + ((~uVar17 | uVar5) ^ uVar13) + 0xa3014314;
  uVar24 = (uVar24 * 0x8000 | uVar24 >> 0x11) + uVar5;
  uVar17 = uVar17 + uVar7 + ((~uVar13 | uVar24) ^ uVar5) + 0x4e0811a1;
  uVar17 = (uVar17 * 0x200000 | uVar17 >> 0xb) + uVar24;
  uVar12 = ((~uVar5 | uVar17) ^ uVar24) + uVar13 + uVar21 + 0xf7537e82;
  uVar21 = (uVar12 * 0x40 | uVar12 >> 0x1a) + uVar17;
  uVar12 = uVar5 + uVar14 + ((~uVar24 | uVar21) ^ uVar17) + 0xbd3af235;
  uVar12 = (uVar12 * 0x400 | uVar12 >> 0x16) + uVar21;
  uVar24 = uVar24 + uVar4 + ((~uVar17 | uVar12) ^ uVar21) + 0x2ad7d2bb;
  uVar24 = (uVar24 * 0x8000 | uVar24 >> 0x11) + uVar12;
  uVar17 = uVar17 + uVar6 + ((~uVar21 | uVar24) ^ uVar12) + 0xeb86d391;
  *state = uVar21 + *state;
  state[1] = uVar1 + uVar24 + (uVar17 * 0x200000 | uVar17 >> 0xb);
  state[2] = uVar24 + uVar2;
  state[3] = uVar12 + uVar3;
  return;
}

Assistant:

static void rhash_md5_process_block(unsigned state[4], const unsigned* x)
{
	register unsigned a, b, c, d;
	a = state[0];
	b = state[1];
	c = state[2];
	d = state[3];

	MD5_ROUND1(a, b, c, d, x[ 0],  7, 0xd76aa478);
	MD5_ROUND1(d, a, b, c, x[ 1], 12, 0xe8c7b756);
	MD5_ROUND1(c, d, a, b, x[ 2], 17, 0x242070db);
	MD5_ROUND1(b, c, d, a, x[ 3], 22, 0xc1bdceee);
	MD5_ROUND1(a, b, c, d, x[ 4],  7, 0xf57c0faf);
	MD5_ROUND1(d, a, b, c, x[ 5], 12, 0x4787c62a);
	MD5_ROUND1(c, d, a, b, x[ 6], 17, 0xa8304613);
	MD5_ROUND1(b, c, d, a, x[ 7], 22, 0xfd469501);
	MD5_ROUND1(a, b, c, d, x[ 8],  7, 0x698098d8);
	MD5_ROUND1(d, a, b, c, x[ 9], 12, 0x8b44f7af);
	MD5_ROUND1(c, d, a, b, x[10], 17, 0xffff5bb1);
	MD5_ROUND1(b, c, d, a, x[11], 22, 0x895cd7be);
	MD5_ROUND1(a, b, c, d, x[12],  7, 0x6b901122);
	MD5_ROUND1(d, a, b, c, x[13], 12, 0xfd987193);
	MD5_ROUND1(c, d, a, b, x[14], 17, 0xa679438e);
	MD5_ROUND1(b, c, d, a, x[15], 22, 0x49b40821);

	MD5_ROUND2(a, b, c, d, x[ 1],  5, 0xf61e2562);
	MD5_ROUND2(d, a, b, c, x[ 6],  9, 0xc040b340);
	MD5_ROUND2(c, d, a, b, x[11], 14, 0x265e5a51);
	MD5_ROUND2(b, c, d, a, x[ 0], 20, 0xe9b6c7aa);
	MD5_ROUND2(a, b, c, d, x[ 5],  5, 0xd62f105d);
	MD5_ROUND2(d, a, b, c, x[10],  9,  0x2441453);
	MD5_ROUND2(c, d, a, b, x[15], 14, 0xd8a1e681);
	MD5_ROUND2(b, c, d, a, x[ 4], 20, 0xe7d3fbc8);
	MD5_ROUND2(a, b, c, d, x[ 9],  5, 0x21e1cde6);
	MD5_ROUND2(d, a, b, c, x[14],  9, 0xc33707d6);
	MD5_ROUND2(c, d, a, b, x[ 3], 14, 0xf4d50d87);
	MD5_ROUND2(b, c, d, a, x[ 8], 20, 0x455a14ed);
	MD5_ROUND2(a, b, c, d, x[13],  5, 0xa9e3e905);
	MD5_ROUND2(d, a, b, c, x[ 2],  9, 0xfcefa3f8);
	MD5_ROUND2(c, d, a, b, x[ 7], 14, 0x676f02d9);
	MD5_ROUND2(b, c, d, a, x[12], 20, 0x8d2a4c8a);

	MD5_ROUND3(a, b, c, d, x[ 5],  4, 0xfffa3942);
	MD5_ROUND3(d, a, b, c, x[ 8], 11, 0x8771f681);
	MD5_ROUND3(c, d, a, b, x[11], 16, 0x6d9d6122);
	MD5_ROUND3(b, c, d, a, x[14], 23, 0xfde5380c);
	MD5_ROUND3(a, b, c, d, x[ 1],  4, 0xa4beea44);
	MD5_ROUND3(d, a, b, c, x[ 4], 11, 0x4bdecfa9);
	MD5_ROUND3(c, d, a, b, x[ 7], 16, 0xf6bb4b60);
	MD5_ROUND3(b, c, d, a, x[10], 23, 0xbebfbc70);
	MD5_ROUND3(a, b, c, d, x[13],  4, 0x289b7ec6);
	MD5_ROUND3(d, a, b, c, x[ 0], 11, 0xeaa127fa);
	MD5_ROUND3(c, d, a, b, x[ 3], 16, 0xd4ef3085);
	MD5_ROUND3(b, c, d, a, x[ 6], 23,  0x4881d05);
	MD5_ROUND3(a, b, c, d, x[ 9],  4, 0xd9d4d039);
	MD5_ROUND3(d, a, b, c, x[12], 11, 0xe6db99e5);
	MD5_ROUND3(c, d, a, b, x[15], 16, 0x1fa27cf8);
	MD5_ROUND3(b, c, d, a, x[ 2], 23, 0xc4ac5665);

	MD5_ROUND4(a, b, c, d, x[ 0],  6, 0xf4292244);
	MD5_ROUND4(d, a, b, c, x[ 7], 10, 0x432aff97);
	MD5_ROUND4(c, d, a, b, x[14], 15, 0xab9423a7);
	MD5_ROUND4(b, c, d, a, x[ 5], 21, 0xfc93a039);
	MD5_ROUND4(a, b, c, d, x[12],  6, 0x655b59c3);
	MD5_ROUND4(d, a, b, c, x[ 3], 10, 0x8f0ccc92);
	MD5_ROUND4(c, d, a, b, x[10], 15, 0xffeff47d);
	MD5_ROUND4(b, c, d, a, x[ 1], 21, 0x85845dd1);
	MD5_ROUND4(a, b, c, d, x[ 8],  6, 0x6fa87e4f);
	MD5_ROUND4(d, a, b, c, x[15], 10, 0xfe2ce6e0);
	MD5_ROUND4(c, d, a, b, x[ 6], 15, 0xa3014314);
	MD5_ROUND4(b, c, d, a, x[13], 21, 0x4e0811a1);
	MD5_ROUND4(a, b, c, d, x[ 4],  6, 0xf7537e82);
	MD5_ROUND4(d, a, b, c, x[11], 10, 0xbd3af235);
	MD5_ROUND4(c, d, a, b, x[ 2], 15, 0x2ad7d2bb);
	MD5_ROUND4(b, c, d, a, x[ 9], 21, 0xeb86d391);

	state[0] += a;
	state[1] += b;
	state[2] += c;
	state[3] += d;
}